

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O3

void __thiscall string_view_rbegin_rend_Test::TestBody(string_view_rbegin_rend_Test *this)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  AssertionResult gtest_ar;
  char local_51;
  Message local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  local_51 = '\0';
  lVar1 = 5;
  do {
    local_50.ss_.ptr_._0_4_ = 0x35 - local_51;
    testing::internal::CmpHelperEQ<int,char>
              (local_48,"\'5\' - count","*iter",(int *)&local_50,"012345" + lVar1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message(&local_50);
      if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x69,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) == 0) goto LAB_001f1623;
      goto LAB_001f1605;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_51 = local_51 + '\x01';
    bVar3 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar3);
  local_50.ss_.ptr_._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,char>(local_48,"6","count",(int *)&local_50,&local_51);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) != 0) {
LAB_001f1605:
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,(int)local_50.ss_.ptr_) + 8))();
      }
    }
  }
LAB_001f1623:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(string_view, rbegin_rend) {
  string_view sv("012345");

  char count = 0;
  for (auto iter = sv.rbegin(), end = sv.rend(); iter != end; ++iter) {
    ASSERT_EQ('5' - count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}